

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O2

void duckdb::ApplyBitmaskAndGetSaltBuild
               (Vector *hashes_v,Vector *salt_v,idx_t *count,idx_t *bitmask)

{
  ulong *puVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  ulong uVar4;
  
  if (hashes_v->vector_type == CONSTANT_VECTOR) {
    puVar1 = (ulong *)hashes_v->data;
    Vector::SetVectorType(salt_v,CONSTANT_VECTOR);
    *(ulong *)salt_v->data = *puVar1 | 0xffffffffffff;
    Vector::Flatten(salt_v,*count);
    *puVar1 = *puVar1 & *bitmask;
    Vector::Flatten(hashes_v,*count);
    return;
  }
  Vector::Flatten(hashes_v,*count);
  pdVar2 = salt_v->data;
  pdVar3 = hashes_v->data;
  for (uVar4 = 0; uVar4 < *count; uVar4 = uVar4 + 1) {
    *(ulong *)(pdVar2 + uVar4 * 8) = *(ulong *)(pdVar3 + uVar4 * 8) | 0xffffffffffff;
    puVar1 = (ulong *)(pdVar3 + uVar4 * 8);
    *puVar1 = *puVar1 & *bitmask;
  }
  return;
}

Assistant:

static void ApplyBitmaskAndGetSaltBuild(Vector &hashes_v, Vector &salt_v, const idx_t &count, const idx_t &bitmask) {
	if (hashes_v.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		auto &hash = *ConstantVector::GetData<hash_t>(hashes_v);
		salt_v.SetVectorType(VectorType::CONSTANT_VECTOR);

		*ConstantVector::GetData<hash_t>(salt_v) = ht_entry_t::ExtractSalt(hash);
		salt_v.Flatten(count);

		hash = hash & bitmask;
		hashes_v.Flatten(count);
	} else {
		hashes_v.Flatten(count);
		auto salts = FlatVector::GetData<hash_t>(salt_v);
		auto hashes = FlatVector::GetData<hash_t>(hashes_v);
		for (idx_t i = 0; i < count; i++) {
			salts[i] = ht_entry_t::ExtractSalt(hashes[i]);
			hashes[i] &= bitmask;
		}
	}
}